

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3DefaultRowEst(Index *pIdx)

{
  ushort uVar1;
  short *psVar2;
  short sVar3;
  ushort uVar4;
  ulong uVar5;
  short sVar6;
  ulong uVar7;
  
  psVar2 = pIdx->aiRowLogEst;
  uVar1 = pIdx->nKeyCol;
  uVar4 = 5;
  if (uVar1 < 5) {
    uVar4 = uVar1;
  }
  sVar6 = pIdx->pTable->nRowLogEst;
  if (sVar6 < 99) {
    pIdx->pTable->nRowLogEst = 99;
    sVar6 = 99;
  }
  sVar3 = sVar6 + -10;
  if (pIdx->pPartIdxWhere == (Expr *)0x0) {
    sVar3 = sVar6;
  }
  *psVar2 = sVar3;
  memcpy(psVar2 + 1,sqlite3DefaultRowEst::aVal,(ulong)(ushort)(uVar4 * 2));
  uVar5 = (ulong)pIdx->nKeyCol;
  if (uVar4 < pIdx->nKeyCol) {
    uVar4 = 5;
    if (uVar1 < 5) {
      uVar4 = uVar1;
    }
    uVar7 = (ulong)uVar4;
    do {
      psVar2[uVar7 + 1] = 0x17;
      uVar7 = uVar7 + 1;
      uVar5 = (ulong)pIdx->nKeyCol;
    } while (uVar7 < uVar5);
  }
  if (pIdx->onError != '\0') {
    psVar2[uVar5] = 0;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DefaultRowEst(Index *pIdx){
               /*                10,  9,  8,  7,  6 */
  static const LogEst aVal[] = { 33, 32, 30, 28, 26 };
  LogEst *a = pIdx->aiRowLogEst;
  LogEst x;
  int nCopy = MIN(ArraySize(aVal), pIdx->nKeyCol);
  int i;

  /* Indexes with default row estimates should not have stat1 data */
  assert( !pIdx->hasStat1 );

  /* Set the first entry (number of rows in the index) to the estimated
  ** number of rows in the table, or half the number of rows in the table
  ** for a partial index.
  **
  ** 2020-05-27:  If some of the stat data is coming from the sqlite_stat1
  ** table but other parts we are having to guess at, then do not let the
  ** estimated number of rows in the table be less than 1000 (LogEst 99).
  ** Failure to do this can cause the indexes for which we do not have
  ** stat1 data to be ignored by the query planner.
  */
  x = pIdx->pTable->nRowLogEst;
  assert( 99==sqlite3LogEst(1000) );
  if( x<99 ){
    pIdx->pTable->nRowLogEst = x = 99;
  }
  if( pIdx->pPartIdxWhere!=0 ){ x -= 10;  assert( 10==sqlite3LogEst(2) ); }
  a[0] = x;

  /* Estimate that a[1] is 10, a[2] is 9, a[3] is 8, a[4] is 7, a[5] is
  ** 6 and each subsequent value (if any) is 5.  */
  memcpy(&a[1], aVal, nCopy*sizeof(LogEst));
  for(i=nCopy+1; i<=pIdx->nKeyCol; i++){
    a[i] = 23;                    assert( 23==sqlite3LogEst(5) );
  }

  assert( 0==sqlite3LogEst(1) );
  if( IsUniqueIndex(pIdx) ) a[pIdx->nKeyCol] = 0;
}